

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# required_fields.c
# Opt level: O0

void upb_FieldPathVector_Reserve(upb_FindContext *ctx,upb_FieldPathVector *vec,size_t elems)

{
  size_t sVar1;
  upb_FieldPathEntry *puVar2;
  size_t local_40;
  int newsize;
  size_t need;
  int oldsize;
  size_t elems_local;
  upb_FieldPathVector *vec_local;
  upb_FindContext *ctx_local;
  
  if (vec->cap - vec->size < elems) {
    sVar1 = vec->cap;
    if (vec->cap < 4) {
      local_40 = 4;
    }
    else {
      local_40 = vec->cap;
    }
    vec->cap = local_40;
    while (vec->cap < vec->size + elems) {
      vec->cap = vec->cap << 1;
    }
    puVar2 = (upb_FieldPathEntry *)
             upb_grealloc(vec->path,(long)(int)(sVar1 << 4),(long)(int)(vec->cap << 4));
    vec->path = puVar2;
    if (vec->path == (upb_FieldPathEntry *)0x0) {
      siglongjmp((__jmp_buf_tag *)ctx->err,1);
    }
  }
  return;
}

Assistant:

static void upb_FieldPathVector_Reserve(upb_FindContext* ctx,
                                        upb_FieldPathVector* vec,
                                        size_t elems) {
  if (vec->cap - vec->size < elems) {
    const int oldsize = vec->cap * sizeof(*vec->path);
    size_t need = vec->size + elems;
    vec->cap = UPB_MAX(4, vec->cap);
    while (vec->cap < need) vec->cap *= 2;
    const int newsize = vec->cap * sizeof(*vec->path);
    vec->path = upb_grealloc(vec->path, oldsize, newsize);
    if (!vec->path) {
      UPB_LONGJMP(ctx->err, 1);
    }
  }
}